

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_pixarlog.c
# Opt level: O1

int PixarLogVSetField(TIFF *tif,uint32_t tag,__va_list_tag *ap)

{
  uint uVar1;
  uint8_t *puVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  uint *puVar6;
  ulong uVar7;
  tmsize_t tVar8;
  char *pcVar9;
  
  puVar2 = tif->tif_data;
  if (tag == 0x1000d) {
    uVar1 = ap->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar6 = (uint *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      puVar6 = (uint *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar6 + 2;
    }
    uVar7 = (ulong)*puVar6;
    *(uint *)(puVar2 + 0x108) = *puVar6;
    if (uVar7 < 6) {
      uVar1 = *(uint *)(&DAT_003358cc + uVar7 * 4);
      TIFFSetField(tif,0x102,(ulong)*(uint *)(&DAT_003358b4 + uVar7 * 4));
      TIFFSetField(tif,0x153,(ulong)uVar1);
    }
    tVar8 = -1;
    if ((tif->tif_flags & 0x400) != 0) {
      tVar8 = TIFFTileSize(tif);
    }
    tif->tif_tilesize = tVar8;
    tVar8 = TIFFScanlineSize(tif);
    tif->tif_scanlinesize = tVar8;
    iVar3 = 1;
  }
  else {
    if (tag != 0x10016) {
      iVar3 = (**(code **)(puVar2 + 0x118))(tif);
      return iVar3;
    }
    uVar1 = ap->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      piVar5 = (int *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      piVar5 = (int *)ap->overflow_arg_area;
      ap->overflow_arg_area = piVar5 + 2;
    }
    iVar4 = *piVar5;
    *(int *)(puVar2 + 0x10c) = iVar4;
    iVar3 = 1;
    if ((tif->tif_mode != 0) && ((puVar2[0x104] & 1) != 0)) {
      iVar4 = deflateParams((z_streamp)(puVar2 + 0x80),iVar4,0);
      if (iVar4 != 0) {
        pcVar9 = "(null)";
        if (*(char **)(puVar2 + 0xb0) != (char *)0x0) {
          pcVar9 = *(char **)(puVar2 + 0xb0);
        }
        TIFFErrorExtR(tif,"PixarLogVSetField","ZLib error: %s",pcVar9);
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

static int PixarLogVSetField(TIFF *tif, uint32_t tag, va_list ap)
{
    static const char module[] = "PixarLogVSetField";
    PixarLogState *sp = (PixarLogState *)tif->tif_data;
    int result;

    switch (tag)
    {
        case TIFFTAG_PIXARLOGQUALITY:
            sp->quality = (int)va_arg(ap, int);
            if (tif->tif_mode != O_RDONLY && (sp->state & PLSTATE_INIT))
            {
                if (deflateParams(&sp->stream, sp->quality,
                                  Z_DEFAULT_STRATEGY) != Z_OK)
                {
                    TIFFErrorExtR(tif, module, "ZLib error: %s",
                                  sp->stream.msg ? sp->stream.msg : "(null)");
                    return (0);
                }
            }
            return (1);
        case TIFFTAG_PIXARLOGDATAFMT:
            sp->user_datafmt = (int)va_arg(ap, int);
            /* Tweak the TIFF header so that the rest of libtiff knows what
             * size of data will be passed between app and library, and
             * assume that the app knows what it is doing and is not
             * confused by these header manipulations...
             */
            switch (sp->user_datafmt)
            {
                case PIXARLOGDATAFMT_8BIT:
                case PIXARLOGDATAFMT_8BITABGR:
                    TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, 8);
                    TIFFSetField(tif, TIFFTAG_SAMPLEFORMAT, SAMPLEFORMAT_UINT);
                    break;
                case PIXARLOGDATAFMT_11BITLOG:
                    TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, 16);
                    TIFFSetField(tif, TIFFTAG_SAMPLEFORMAT, SAMPLEFORMAT_UINT);
                    break;
                case PIXARLOGDATAFMT_12BITPICIO:
                    TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, 16);
                    TIFFSetField(tif, TIFFTAG_SAMPLEFORMAT, SAMPLEFORMAT_INT);
                    break;
                case PIXARLOGDATAFMT_16BIT:
                    TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, 16);
                    TIFFSetField(tif, TIFFTAG_SAMPLEFORMAT, SAMPLEFORMAT_UINT);
                    break;
                case PIXARLOGDATAFMT_FLOAT:
                    TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, 32);
                    TIFFSetField(tif, TIFFTAG_SAMPLEFORMAT,
                                 SAMPLEFORMAT_IEEEFP);
                    break;
            }
            /*
             * Must recalculate sizes should bits/sample change.
             */
            tif->tif_tilesize =
                isTiled(tif) ? TIFFTileSize(tif) : (tmsize_t)(-1);
            tif->tif_scanlinesize = TIFFScanlineSize(tif);
            result = 1; /* NB: pseudo tag */
            break;
        default:
            result = (*sp->vsetparent)(tif, tag, ap);
    }
    return (result);
}